

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O0

void breakstat(LexState *ls)

{
  FuncState *fs_00;
  byte bVar1;
  int l2;
  bool bVar2;
  BlockCnt *pBStack_20;
  int upval;
  BlockCnt *bl;
  FuncState *fs;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  pBStack_20 = fs_00->bl;
  bVar1 = 0;
  while( true ) {
    bVar2 = false;
    if (pBStack_20 != (BlockCnt *)0x0) {
      bVar2 = pBStack_20->isbreakable == '\0';
    }
    if (!bVar2) break;
    bVar1 = pBStack_20->upval | bVar1;
    pBStack_20 = pBStack_20->previous;
  }
  if (pBStack_20 == (BlockCnt *)0x0) {
    luaX_syntaxerror(ls,"no loop to break");
  }
  if (bVar1 != 0) {
    luaK_codeABC(fs_00,OP_CLOSE,(uint)pBStack_20->nactvar,0,0);
  }
  l2 = luaK_jump(fs_00);
  luaK_concat(fs_00,&pBStack_20->breaklist,l2);
  return;
}

Assistant:

static void breakstat (LexState *ls) {
  FuncState *fs = ls->fs;
  BlockCnt *bl = fs->bl;
  int upval = 0;
  while (bl && !bl->isbreakable) {
    upval |= bl->upval;
    bl = bl->previous;
  }
  if (!bl)
    luaX_syntaxerror(ls, "no loop to break");
  if (upval)
    luaK_codeABC(fs, OP_CLOSE, bl->nactvar, 0, 0);
  luaK_concat(fs, &bl->breaklist, luaK_jump(fs));
}